

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

int prvTidyDecodeUTF8BytesToChar
              (uint *c,uint firstByte,ctmbstr successorBytes,TidyInputSource *inp,int *count)

{
  bool bVar1;
  Bool BVar2;
  int iVar3;
  bool bVar4;
  byte local_75;
  int local_74;
  byte theByte;
  int tempCount;
  int hi;
  int lo;
  int b;
  Bool hasError;
  int bytes;
  int i;
  uint n;
  uint ch;
  byte *buf;
  byte tempbuf [10];
  int *count_local;
  TidyInputSource *inp_local;
  ctmbstr successorBytes_local;
  uint firstByte_local;
  uint *c_local;
  
  _n = (ctmbstr)((long)&buf + 6);
  bVar1 = false;
  if (successorBytes != (ctmbstr)0x0) {
    _n = successorBytes;
  }
  if (firstByte == 0xffffffff) {
    *c = 0xffffffff;
    *count = 1;
    c_local._4_4_ = 0;
  }
  else {
    bytes = firstByte;
    if (firstByte < 0x80) {
      b = 1;
    }
    else if ((firstByte & 0xe0) == 0xc0) {
      bytes = firstByte & 0x1f;
      b = 2;
    }
    else if ((firstByte & 0xf0) == 0xe0) {
      bytes = firstByte & 0xf;
      b = 3;
    }
    else if ((firstByte & 0xf8) == 0xf0) {
      bytes = firstByte & 7;
      b = 4;
    }
    else {
      if ((firstByte & 0xfc) == 0xf8) {
        bytes = firstByte & 3;
        b = 5;
      }
      else if ((firstByte & 0xfe) == 0xfc) {
        bytes = firstByte & 1;
        b = 6;
      }
      else {
        b = 1;
      }
      bVar1 = true;
    }
    tempbuf._2_8_ = count;
    if (successorBytes == (ctmbstr)0x0) {
      if (inp == (TidyInputSource *)0x0) {
        if (1 < (uint)b) {
          bVar1 = true;
          b = 1;
        }
      }
      else {
        hasError = no;
        while( true ) {
          bVar4 = false;
          if ((int)hasError < b + -1) {
            BVar2 = (*inp->eof)(inp->sourceData);
            bVar4 = BVar2 == no;
          }
          if (!bVar4) goto LAB_0016d92a;
          iVar3 = (*inp->getByte)(inp->sourceData);
          _n[(int)hasError] = (tmbchar)iVar3;
          if ((iVar3 == -1) || ((_n[(int)hasError] & 0xc0U) != 0x80)) break;
          bytes = bytes << 6 | (byte)_n[(int)hasError] & 0x3f;
          hasError = hasError + yes;
        }
        bVar1 = true;
        b = hasError + yes;
        if (iVar3 != -1) {
          (*inp->ungetByte)(inp->sourceData,_n[(int)hasError]);
        }
      }
    }
    else {
      for (hasError = no; (int)hasError < b + -1; hasError = hasError + yes) {
        if ((_n[(int)hasError] == '\0') || ((_n[(int)hasError] & 0xc0U) != 0x80)) {
          bVar1 = true;
          b = hasError + yes;
          break;
        }
        bytes = bytes << 6 | (byte)_n[(int)hasError] & 0x3f;
      }
    }
LAB_0016d92a:
    if ((!bVar1) && ((bytes == 0xfffe || (bytes == 0xffff)))) {
      bVar1 = true;
    }
    if ((!bVar1) && (0x10ffff < (uint)bytes)) {
      bVar1 = true;
    }
    if (!bVar1) {
      hasError = offsetUTF8Sequences[b + -1];
      if (((uint)bytes < validUTF8[(int)hasError].lowChar) ||
         (validUTF8[offsetUTF8Sequences[b] + -1].highChar < (uint)bytes)) {
        bVar1 = true;
      }
      else {
        bVar1 = true;
        for (; (int)hasError <= offsetUTF8Sequences[b] + -1; hasError = hasError + yes) {
          for (local_74 = 0; local_74 < b; local_74 = local_74 + 1) {
            if (local_74 == 0) {
              local_75 = (byte)firstByte;
            }
            else {
              local_75 = _n[local_74 + -1];
            }
            if ((*(byte *)((long)(int)hasError * 0x14 + 0x1a916c + (long)(local_74 << 1)) <=
                 local_75) &&
               (local_75 <=
                *(byte *)((long)(int)hasError * 0x14 + 0x1a916c + (long)(local_74 * 2 + 1)))) {
              bVar1 = false;
            }
            if (bVar1) break;
          }
        }
      }
    }
    *(int *)tempbuf._2_8_ = b;
    *c = bytes;
    if (bVar1) {
      c_local._4_4_ = -1;
    }
    else {
      c_local._4_4_ = 0;
    }
  }
  return c_local._4_4_;
}

Assistant:

int TY_(DecodeUTF8BytesToChar)( uint* c, uint firstByte, ctmbstr successorBytes,
                                TidyInputSource* inp, int* count )
{
    byte tempbuf[10];
    byte *buf = &tempbuf[0];
    uint ch = 0, n = 0;
    int i, bytes = 0;
    Bool hasError = no;
    
    if ( successorBytes )
        buf = (byte*) successorBytes;
        
    /* special check if we have been passed an EOF char */
    if ( firstByte == EndOfStream )
    {
        /* at present */
        *c = firstByte;
        *count = 1;
        return 0;
    }

    ch = firstByte; /* first byte is passed in separately */
    
    if (ch <= 0x7F) /* 0XXX XXXX one byte */
    {
        n = ch;
        bytes = 1;
    }
    else if ((ch & 0xE0) == 0xC0)  /* 110X XXXX  two bytes */
    {
        n = ch & 31;
        bytes = 2;
    }
    else if ((ch & 0xF0) == 0xE0)  /* 1110 XXXX  three bytes */
    {
        n = ch & 15;
        bytes = 3;
    }
    else if ((ch & 0xF8) == 0xF0)  /* 1111 0XXX  four bytes */
    {
        n = ch & 7;
        bytes = 4;
    }
    else if ((ch & 0xFC) == 0xF8)  /* 1111 10XX  five bytes */
    {
        n = ch & 3;
        bytes = 5;
        hasError = yes;
    }
    else if ((ch & 0xFE) == 0xFC)  /* 1111 110X  six bytes */
    {
        n = ch & 1;
        bytes = 6;
        hasError = yes;
    }
    else
    {
        /* not a valid first byte of a UTF-8 sequence */
        n = ch;
        bytes = 1;
        hasError = yes;
    }

    /* successor bytes should have the form 10XX XXXX */

    /* If caller supplied buffer, use it.  Else see if caller
    ** supplied an input source, use that.
    */
    if ( successorBytes )
    {
        for ( i=0; i < bytes-1; ++i )
        {
            if ( !buf[i] || (buf[i] & 0xC0) != 0x80 )
            {
                hasError = yes;
                bytes = i+1;
                break;
            }
            n = (n << 6) | (buf[i] & 0x3F);
        }
    }
    else if ( inp )
    {
        for ( i=0; i < bytes-1 && !inp->eof(inp->sourceData); ++i )
        {
            int b = inp->getByte( inp->sourceData );
            buf[i] = (tmbchar) b;

            /* End of data or illegal successor byte value */
            if ( b == EOF || (buf[i] & 0xC0) != 0x80 )
            {
                hasError = yes;
                bytes = i+1;
                if ( b != EOF )
                    inp->ungetByte( inp->sourceData, buf[i] );
                break;
            }
            n = (n << 6) | (buf[i] & 0x3F);
        }
    }
    else if ( bytes > 1 )
    {
        hasError = yes;
        bytes = 1;
    }
    
    if (!hasError && ((n == kUTF8ByteSwapNotAChar) || (n == kUTF8NotAChar)))
        hasError = yes;
        
    if (!hasError && (n > kMaxUTF8FromUCS4))
        hasError = yes;

    if (!hasError)
    {
        int lo, hi;
        
        lo = offsetUTF8Sequences[bytes - 1];
        hi = offsetUTF8Sequences[bytes] - 1;
        
        /* check for overlong sequences */
        if ((n < validUTF8[lo].lowChar) || (n > validUTF8[hi].highChar))
            hasError = yes;
        else
        {
            hasError = yes; /* assume error until proven otherwise */
        
            for (i = lo; i <= hi; i++)
            {
                int tempCount;
                byte theByte;
                
                for (tempCount = 0; tempCount < bytes; tempCount++)
                {
                    if (!tempCount)
                        theByte = (tmbchar) firstByte;
                    else
                        theByte = buf[tempCount - 1];
                        
                    if ( theByte >= validUTF8[i].validBytes[(tempCount * 2)] &&
                         theByte <= validUTF8[i].validBytes[(tempCount * 2) + 1] )
                        hasError = no;
                    if (hasError)
                        break;
                }
            }
        }
    }

#if 1 && defined(_DEBUG)
    if ( hasError )
    {
       /* debug */
       fprintf( stderr, "UTF-8 decoding error of %d bytes : ", bytes );
       fprintf( stderr, "0x%02x ", firstByte );
       for (i = 1; i < bytes; i++)
           fprintf( stderr, "0x%02x ", buf[i - 1] );
       fprintf( stderr, " = U+%04X\n", n );
    }
#endif

    *count = bytes;
    *c = n;
    if ( hasError )
        return -1;
    return 0;
}